

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall astar::Map::Print(Map *this)

{
  ostream *poVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if (1 < this->n) {
    lVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
      if (this->m < 2) {
        uVar2 = (ulong)(this->m - 1);
      }
      else {
        lVar4 = 0;
        do {
          poVar1 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              *(int *)(*(long *)&(this->map).
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl + lVar4 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
          lVar4 = lVar4 + 1;
          uVar2 = (long)this->m - 1;
        } while (lVar4 < (long)uVar2);
      }
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->map).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)(int)uVar2 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"},",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
    } while (lVar5 < (long)this->n + -1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  iVar3 = this->m;
  if (iVar3 < 2) {
    uVar2 = (ulong)(iVar3 - 1);
  }
  else {
    lVar5 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->map).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [(long)this->n + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  lVar5 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      lVar5 = lVar5 + 1;
      iVar3 = this->m;
      uVar2 = (long)iVar3 - 1;
    } while (lVar5 < (long)uVar2);
  }
  if (iVar3 < 1 || (long)this->n < 1) {
    return;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      *(int *)(*(long *)&(this->map).
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [(long)this->n + -1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              (long)(int)uVar2 * 4));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n}",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Map::Print()
{
    std::cout << "{" << std::endl;
    for (int i = 0; i < (n - 1); i++) {
        std::cout << "{";
        for (int j = 0; j < (m - 1); j++) {
            std::cout << map[i][j] << ", ";
        }
        std::cout << map[i][m - 1] << "}," << std::endl;
    }
    std::cout << "{";
    for (int j = 0; j < (m - 1); j++) {
        std::cout << map[n - 1][j] << ", ";
    }
    if (n > 0 && m > 0) {
        std::cout << map[n - 1][m - 1] << "}\n}" << std::endl;
    }
}